

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_pcm_frames(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  ulong uVar4;
  
  if (pBufferOut == (void *)0x0 || (framesToRead == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  dVar3 = 0;
  if ((pWav->translatedFormatTag != 2) && (pWav->translatedFormatTag != 0x11)) {
    uVar2 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample;
    if ((uVar2 < 8) || ((uVar2 & 7) != 0)) {
      uVar1 = (pWav->fmt).blockAlign;
      uVar2 = (uint)uVar1;
      if (uVar1 == 0) {
        return 0;
      }
    }
    else {
      uVar2 = uVar2 >> 3;
    }
    uVar4 = framesToRead * uVar2;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      if (pWav->bytesRemaining < uVar4) {
        uVar4 = pWav->bytesRemaining;
      }
      uVar4 = (*pWav->onRead)(pWav->pUserData,pBufferOut,uVar4);
      pWav->bytesRemaining = pWav->bytesRemaining - uVar4;
    }
    dVar3 = uVar4 / uVar2;
  }
  return dVar3;
}

Assistant:

drwav_uint64 drwav_read_pcm_frames(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Cannot use this function for compressed formats.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }

    drwav_uint32 bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (framesToRead * bytesPerFrame > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / bytesPerFrame;
    }

    size_t bytesRead = drwav_read_raw(pWav, (size_t)(framesToRead * bytesPerFrame), pBufferOut);
    return bytesRead / bytesPerFrame;
}